

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_standard_from_disk.unit.cpp
# Opt level: O0

void __thiscall
TestLoadStandardFromDisk_TestLoadCEN_Test::TestBody(TestLoadStandardFromDisk_TestLoadCEN_Test *this)

{
  bool bVar1;
  Message *message;
  char *message_00;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  size_type local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  undefined1 local_e0 [8];
  Optical_Standard cen;
  undefined1 local_40 [8];
  path std_path;
  ScopedTrace gtest_trace_262;
  TestLoadStandardFromDisk_TestLoadCEN_Test *this_local;
  
  testing::ScopedTrace::ScopedTrace
            ((ScopedTrace *)&std_path.field_0x27,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
             ,0x106,"Begin Test: Load CEN from disk.");
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_40,&test_dir_abi_cxx11_,auto_format);
  std::filesystem::__cxx11::path::operator/=((path *)local_40,(char (*) [10])"standards");
  std::filesystem::__cxx11::path::operator/=((path *)local_40,(char (*) [17])"CENblackbody.std");
  std::filesystem::__cxx11::path::string((string *)&gtest_ar.message_,(path *)local_40);
  window_standards::load_optical_standard((Optical_Standard *)local_e0,(string *)&gtest_ar.message_)
  ;
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  local_118 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                      *)((long)&cen.file.field_2 + 8));
  local_11c = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_110,"cen.methods.size()","7",&local_118,&local_11c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    message = testing::Message::operator<<(&local_128,(char (*) [25])"Number of methods loaded");
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x10d,message_00);
    testing::internal::AssertHelper::operator=(&local_130,message);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  window_standards::Optical_Standard::~Optical_Standard((Optical_Standard *)local_e0);
  std::filesystem::__cxx11::path::~path((path *)local_40);
  testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&std_path.field_0x27);
  return;
}

Assistant:

TEST_F(TestLoadStandardFromDisk, TestLoadCEN) {
	SCOPED_TRACE("Begin Test: Load CEN from disk.");

	std::filesystem::path std_path(test_dir);
	std_path /= "standards";
	std_path /= "CENblackbody.std";

	Optical_Standard cen = load_optical_standard(std_path.string());	
	EXPECT_EQ(cen.methods.size(), 7) << "Number of methods loaded";

}